

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day15a.cpp
# Opt level: O2

istream * day15a::operator>>(istream *is,Disc *disc)

{
  istream *piVar1;
  string d;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  local_28 = local_18;
  local_20 = 0;
  local_18[0] = 0;
  piVar1 = std::operator>>(is,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&disc->max);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&disc->position);
  piVar1 = std::operator>>(piVar1,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return piVar1;
}

Assistant:

std::istream& operator >> (std::istream& is, Disc& disc) {
		std::string d;
		return is >> d >> d >> d >> disc.max >> d >> d >> d >> d >> d >> d >> d >> disc.position >> d;
	}